

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemove.cc
# Opt level: O2

void board::makemove::addPiece(int piece,int square,Board *pos)

{
  int iVar1;
  int sq;
  
  iVar1 = Board::PIECE_COLOR[piece];
  pos->material[iVar1] = pos->material[iVar1] + Board::PIECE_VAL[piece];
  pos->board[square] = piece;
  pos->hashKey = pos->hashKey ^ Board::PIECE_KEYS[piece][square];
  if (Board::PIECE_NO_TEAM[piece] == 1) {
    sq = Board::SQ64[square];
    bitboard::setBit(pos->pawns + iVar1,sq);
    bitboard::setBit(pos->pawns + 2,sq);
  }
  pos->pList[piece][pos->pNum[piece]] = square;
  pos->pNum[piece] = pos->pNum[piece] + 1;
  return;
}

Assistant:

inline void board::makemove::addPiece(const int piece, const int square, Board& pos)
{
    int color = Board::PIECE_COLOR[piece];
    pos.addMaterial(color, Board::PIECE_VAL[piece]);
    pos.setSquare(square, piece);
    pos.hashPiece(piece, square);
    if (Board::PIECE_NO_TEAM[piece] == WP) {
        bitboard::setBit(pos.getPawns()[color], Board::SQ64[square]);
        bitboard::setBit(pos.getPawns()[BOTH], Board::SQ64[square]);
    }
    pos.getPieceList(piece)[pos.getPieceNum(piece)] = square;
    pos.incrementPieceNum(piece);
}